

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  int iVar1;
  OPENSSL_STACK *sk;
  uint8_t *puVar2;
  void *pvVar3;
  byte bVar4;
  uint8_t *i;
  byte bVar5;
  uint16_t profile_id;
  CBS profile_ids_tmp;
  CBS profile_ids;
  CBS srtp_mki;
  ushort local_72;
  OPENSSL_STACK *local_70;
  uint8_t *local_68;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  bVar4 = 1;
  if (contents != (CBS *)0x0) {
    ssl = (SSL *)hs->ssl;
    iVar1 = SSL_is_dtls((SSL *)ssl);
    if (iVar1 != 0) {
      iVar1 = CBS_get_u16_length_prefixed(contents,&local_50);
      if ((((iVar1 == 0) || (local_50.len < 2)) ||
          (iVar1 = CBS_get_u8_length_prefixed(contents,&local_40), iVar1 == 0)) ||
         (contents->len != 0)) {
        bVar4 = 0;
        ERR_put_error(0x10,0,0x74,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x6c3);
      }
      else {
        sk = (OPENSSL_STACK *)SSL_get_srtp_profiles(ssl);
        puVar2 = (uint8_t *)OPENSSL_sk_num(sk);
        bVar4 = 1;
        if (puVar2 != (uint8_t *)0x0) {
          i = (uint8_t *)0x0;
          local_70 = sk;
          local_68 = puVar2;
          do {
            pvVar3 = OPENSSL_sk_value(local_70,(size_t)i);
            puVar2 = local_50.data;
            local_60.len = local_50.len;
joined_r0x0013d582:
            if (local_60.len != 0) {
              iVar1 = CBS_get_u16(&local_60,&local_72);
              bVar5 = iVar1 != 0;
              puVar2 = (uint8_t *)(ulong)bVar5;
              if ((bool)bVar5) goto code_r0x0013d596;
              goto LAB_0013d5c5;
            }
            i = i + 1;
            local_60.len = 0;
          } while (i != local_68);
        }
        bVar5 = (byte)puVar2;
LAB_0013d5c7:
        bVar4 = bVar4 | bVar5;
      }
    }
  }
  return (bool)(bVar4 & 1);
code_r0x0013d596:
  if (*(ulong *)((long)pvVar3 + 8) == (ulong)local_72) {
    *(void **)(ssl->handshake_func + 0x280) = pvVar3;
LAB_0013d5c5:
    bVar4 = 0;
    goto LAB_0013d5c7;
  }
  goto joined_r0x0013d582;
}

Assistant:

static bool ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  SSL *const ssl = hs->ssl;
  // DTLS-SRTP is only defined for DTLS.
  if (contents == NULL || !SSL_is_dtls(ssl)) {
    return true;
  }

  CBS profile_ids, srtp_mki;
  if (!CBS_get_u16_length_prefixed(contents, &profile_ids) ||
      CBS_len(&profile_ids) < 2 ||
      !CBS_get_u8_length_prefixed(contents, &srtp_mki) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
    return false;
  }
  // Discard the MKI value for now.

  const STACK_OF(SRTP_PROTECTION_PROFILE) *server_profiles =
      SSL_get_srtp_profiles(ssl);

  // Pick the server's most preferred profile.
  for (const SRTP_PROTECTION_PROFILE *server_profile : server_profiles) {
    CBS profile_ids_tmp;
    CBS_init(&profile_ids_tmp, CBS_data(&profile_ids), CBS_len(&profile_ids));

    while (CBS_len(&profile_ids_tmp) > 0) {
      uint16_t profile_id;
      if (!CBS_get_u16(&profile_ids_tmp, &profile_id)) {
        return false;
      }

      if (server_profile->id == profile_id) {
        ssl->s3->srtp_profile = server_profile;
        return true;
      }
    }
  }

  return true;
}